

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

RegisterList * reglist_insert(Context *ctx,RegisterList *prev,RegisterType regtype,int regnum)

{
  RegisterList *pRVar1;
  RegisterList *pRVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = regtype << 0x10 | regnum;
  do {
    pRVar1 = prev;
    prev = pRVar1->next;
    if (prev == (RegisterList *)0x0) break;
    uVar4 = prev->regtype << 0x10 | prev->regnum;
    if (uVar3 == uVar4) {
      return prev;
    }
  } while (uVar4 <= uVar3);
  pRVar2 = (RegisterList *)(*ctx->malloc)(0x30,ctx->malloc_data);
  if (pRVar2 == (RegisterList *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pRVar2 = (RegisterList *)0x0;
  }
  else {
    pRVar2->regtype = regtype;
    pRVar2->regnum = regnum;
    pRVar2->usage = MOJOSHADER_USAGE_UNKNOWN;
    pRVar2->array = (VariableList *)0x0;
    pRVar2->index = 0;
    pRVar2->writemask = 0;
    pRVar2->misc = 0;
    pRVar2->written = 0;
    pRVar2->next = pRVar1->next;
    pRVar1->next = pRVar2;
  }
  return pRVar2;
}

Assistant:

static RegisterList *reglist_insert(Context *ctx, RegisterList *prev,
                                    const RegisterType regtype,
                                    const int regnum)
{
    const uint32 newval = reg_to_ui32(regtype, regnum);
    RegisterList *item = prev->next;
    while (item != NULL)
    {
        const uint32 val = reg_to_ui32(item->regtype, item->regnum);
        if (newval == val)
            return item;  // already set, so we're done.
        else if (newval < val)  // insert it here.
            break;
        else // if (newval > val)
        {
            // keep going, we're not to the insertion point yet.
            prev = item;
            item = item->next;
        } // else
    } // while

    // we need to insert an entry after (prev).
    item = (RegisterList *) Malloc(ctx, sizeof (RegisterList));
    if (item != NULL)
    {
        item->regtype = regtype;
        item->regnum = regnum;
        item->usage = MOJOSHADER_USAGE_UNKNOWN;
        item->index = 0;
        item->writemask = 0;
        item->misc = 0;
        item->written = 0;
        item->array = NULL;
        item->next = prev->next;
        prev->next = item;
    } // if

    return item;
}